

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

void __thiscall HPreData::print(HPreData *this,int k)

{
  pointer pdVar1;
  pointer piVar2;
  pointer piVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  size_t i;
  ulong uVar8;
  size_t j;
  ulong uVar9;
  char buff [4];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"N=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->numCol);
  poVar4 = std::operator<<(poVar4,",  M=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->numRow);
  poVar4 = std::operator<<(poVar4,",  NZ= ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numCol]);
  std::operator<<(poVar4,'\n');
  std::operator<<((ostream *)&std::cout,"\n-----in-------\n");
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  if (k == 2) {
    uVar8 = 0;
    while( true ) {
      pdVar1 = (this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8)
      break;
      sprintf(buff,"%2.1g ",pdVar1[uVar8]);
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,buff);
      uVar8 = uVar8 + 1;
    }
  }
  else if (k == 1) {
    uVar8 = 0;
    while( true ) {
      pdVar1 = (this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8)
      break;
      sprintf(buff,"%2.1g ",pdVar1[uVar8]);
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,buff);
      uVar8 = uVar8 + 1;
    }
  }
  else if (k == 0) {
    uVar8 = 0;
    while( true ) {
      pdVar1 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8) break;
      sprintf(buff,"%2.1g ",pdVar1[uVar8]);
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,buff);
      uVar8 = uVar8 + 1;
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"------A-|-b-----\n");
  uVar6 = 0;
  uVar8 = (ulong)(uint)(&this->numRow)[k != 0];
  if ((&this->numRow)[k != 0] < 1) {
    uVar8 = uVar6;
  }
  do {
    if (uVar6 == uVar8) {
      std::operator<<((ostream *)&std::cout,"------l------\n");
      uVar8 = 0;
      while( true ) {
        pdVar1 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->colLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8)
        break;
        if (pdVar1[uVar8] <= -1e+200) {
          builtin_strncpy(buff,"-inf",4);
        }
        else {
          sprintf(buff,"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,buff);
        uVar8 = uVar8 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      uVar8 = 0;
      while( true ) {
        pdVar1 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->colUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar8)
        break;
        if (1e+200 <= pdVar1[uVar8]) {
          builtin_strncpy(buff,"inf",4);
        }
        else {
          sprintf(buff,"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,buff);
        uVar8 = uVar8 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    if ((this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] != 0) {
      for (uVar9 = 0;
          piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar9 < ((long)(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2 >> 2) - 1U;
          uVar9 = uVar9 + 1) {
        piVar3 = (this->Aend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar5 = (long)piVar2[uVar9];
            uVar6 != (uint)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5]; lVar5 = lVar5 + 1) {
          if (piVar3[uVar9] <= lVar5) {
            pcVar7 = "   ";
            if ((this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] != 0) goto LAB_0014b313;
            goto LAB_0014b32b;
          }
        }
        if ((this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] != 0) {
          pcVar7 = "   ";
          if ((int)lVar5 < piVar3[uVar9]) {
            sprintf(buff,"%2.1g ",
                    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5]);
            pcVar7 = buff;
          }
LAB_0014b313:
          *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
          std::operator<<((ostream *)&std::cout,pcVar7);
        }
LAB_0014b32b:
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"  |   ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
      poVar4 = std::ostream::_M_insert<double>
                         ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6]);
      std::operator<<(poVar4," < < ");
      poVar4 = std::ostream::_M_insert<double>
                         ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6]);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void HPreData::print(int k) {
	cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';
	cout<<"\n-----in-------\n";

	char buff [4];
	cout<<"\n-----cost-----\n";

	if (k==0) {
		for (size_t i=0;i<colCost.size();i++) {
			sprintf(buff, "%2.1g ", colCost[i]);
			cout<<std::setw(5)<<buff;
		}
	}

	if (k==1) {
		for (size_t i=0;i<colCostAtEl.size();i++) {
			sprintf(buff, "%2.1g ", colCostAtEl[i]);
			cout<<std::setw(5)<<buff;
		}
	}

	if (k==2) {
		for (size_t i=0;i<colCostAtEl.size();i++) {
			sprintf(buff, "%2.1g ", colCostAtEl[i]);
			cout<<std::setw(5)<<buff;
		}
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	int rows= numRow;
	if (k)
		 rows= numRowOriginal;

	for (int i=0;i<rows;i++) {
		if (flagRow[i] ) {
			for (size_t j=0;j<Astart.size()-1;j++) {

				int ind = Astart[j];
				while (Aindex[ind]!=i && ind<Aend[j])
					ind++;

				if (!flagCol[j])
					continue;

				//if a_ij is nonzero print
				if (Aindex[ind]==i && ind<Aend[j])
				{
					sprintf(buff, "%2.1g ", Avalue[ind]);
					cout<<std::setw(5)<<buff;
					}
				else cout<<std::setw(5)<<"   ";

			}
			cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
		}
	}
	cout<<"------l------\n";
	for (size_t i=0;i<colLower.size();i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------u------\n";
	for (size_t i=0;i<colUpper.size();i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else
			sprintf(buff, "inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
}